

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> __thiscall
bloaty::MmapInputFileFactory::OpenFile(MmapInputFileFactory *this,string *filename)

{
  bool bVar1;
  string *in_RDX;
  _Head_base<0UL,_bloaty::InputFile_*,_false> in_RDI;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *ret;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *in_stack_000002b8;
  string_view in_stack_000002c0;
  _Head_base<0UL,_bloaty::InputFile_*,_false> _Var2;
  int line;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  _Var2._M_head_impl = in_RDI._M_head_impl;
  std::unique_ptr<bloaty::InputFile,std::default_delete<bloaty::InputFile>>::
  unique_ptr<std::default_delete<bloaty::InputFile>,void>
            ((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
             in_RDI._M_head_impl);
  line = (int)((ulong)_Var2._M_head_impl >> 0x20);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
  bVar1 = MmapInputFile::DoTryOpen(in_stack_000002c0,in_stack_000002b8);
  if (bVar1) {
    return (__uniq_ptr_data<bloaty::InputFile,_std::default_delete<bloaty::InputFile>,_true,_true>)
           (tuple<bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>)in_RDI._M_head_impl;
  }
  Throw((char *)CONCAT44(in_stack_ffffffffffffffc4,CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0)),
        line);
}

Assistant:

std::unique_ptr<InputFile> MmapInputFileFactory::OpenFile(
    const std::string& filename) const {
  std::unique_ptr<InputFile> ret;
  if (!MmapInputFile::DoTryOpen(filename, ret)) {
    THROW("Failed to open file.");
  }
  return ret;
}